

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_BasicRepeatedTest_SetField_Test::TestBody
          (ComparisonTest_BasicRepeatedTest_SetField_Test *this)

{
  bool bVar1;
  char *message;
  TestAllTypes *this_00;
  TestAllTypes *this_01;
  AssertHelper local_88;
  Message local_80;
  string local_78;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  allocator<char> local_31;
  string local_30;
  ComparisonTest_BasicRepeatedTest_SetField_Test *local_10;
  ComparisonTest_BasicRepeatedTest_SetField_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"repeated_int32",&local_31)
  ;
  ComparisonTest::field_as_set(&this->super_ComparisonTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  this_00 = &(this->super_ComparisonTest).proto1_;
  proto2_unittest::TestAllTypes::clear_repeated_int32(this_00);
  this_01 = &(this->super_ComparisonTest).proto2_;
  proto2_unittest::TestAllTypes::clear_repeated_int32(this_01);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_00,0x1f5);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_00,0x1f6);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_00,0x1f7);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_00,500);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_00,500);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_01,500);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_01,0x1fd);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_01,0x1f7);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_01,0x1f6);
  proto2_unittest::TestAllTypes::add_repeated_int32(this_01,0x1f8);
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_(&local_78,this);
  testing::internal::EqHelper::
  Compare<char[229],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_58,
             "\"moved: repeated_int32[1] -> repeated_int32[3] : 502\\n\" \"moved: repeated_int32[3] -> repeated_int32[0] : 500\\n\" \"added: repeated_int32[1]: 509\\n\" \"added: repeated_int32[4]: 504\\n\" \"deleted: repeated_int32[0]: 501\\n\" \"deleted: repeated_int32[4]: 500\\n\""
             ,"Run()",(char (*) [229])
                      "moved: repeated_int32[1] -> repeated_int32[3] : 502\nmoved: repeated_int32[3] -> repeated_int32[0] : 500\nadded: repeated_int32[1]: 509\nadded: repeated_int32[4]: 504\ndeleted: repeated_int32[0]: 501\ndeleted: repeated_int32[4]: 500\n"
             ,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xdae,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  return;
}

Assistant:

TEST_F(ComparisonTest, BasicRepeatedTest_SetField) {
  field_as_set("repeated_int32");
  proto1_.clear_repeated_int32();
  proto2_.clear_repeated_int32();

  proto1_.add_repeated_int32(501);
  proto1_.add_repeated_int32(502);
  proto1_.add_repeated_int32(503);
  proto1_.add_repeated_int32(500);
  proto1_.add_repeated_int32(500);

  proto2_.add_repeated_int32(500);
  proto2_.add_repeated_int32(509);
  proto2_.add_repeated_int32(503);
  proto2_.add_repeated_int32(502);
  proto2_.add_repeated_int32(504);

  EXPECT_EQ(
      "moved: repeated_int32[1] -> repeated_int32[3] : 502\n"
      "moved: repeated_int32[3] -> repeated_int32[0] : 500\n"
      "added: repeated_int32[1]: 509\n"
      "added: repeated_int32[4]: 504\n"
      "deleted: repeated_int32[0]: 501\n"
      "deleted: repeated_int32[4]: 500\n",
      Run());
}